

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

bool convertToIpv4(quint32 *a,Q_IPV6ADDR *a6,ConversionMode mode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (((QFlagsStorage<QHostAddress::ConversionModeFlag>)
       mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
       super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i !=
       (QFlagsStorage<QHostAddress::ConversionModeFlag>)0x0) && (*(long *)a6->c == 0)) {
    uVar2 = *(uint *)(a6->c + 8);
    uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    if (uVar2 == 0) {
      uVar2 = *(uint *)(a6->c + 0xc);
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if (uVar2 == 1) {
        uVar1 = (uint)mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
                      super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i & 8;
        uVar3 = 0x7f000001;
      }
      else {
        if ((uVar2 == 0) &&
           (uVar3 = 0,
           ((uint)mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
                  super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i & 4) != 0))
        goto LAB_0019fd60;
        uVar1 = (uint)mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
                      super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i & 2;
        uVar3 = uVar2;
      }
      if (uVar1 != 0) goto LAB_0019fd60;
    }
    else if ((uVar2 == 0xffff) &&
            (((uint)mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
                    super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i & 1) != 0)) {
      uVar2 = *(uint *)(a6->c + 0xc);
      uVar3 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
LAB_0019fd60:
      *a = uVar3;
      return true;
    }
  }
  return false;
}

Assistant:

static bool convertToIpv4(quint32& a, const Q_IPV6ADDR &a6, const QHostAddress::ConversionMode mode)
{
    if (mode == QHostAddress::StrictConversion)
        return false;

    const uchar *ptr = a6.c;
    if (qFromUnaligned<quint64>(ptr) != 0)
        return false;

    const quint32 mid = qFromBigEndian<quint32>(ptr + 8);
    if ((mid == 0xffff) && (mode & QHostAddress::ConvertV4MappedToIPv4)) {
        a = qFromBigEndian<quint32>(ptr + 12);
        return true;
    }
    if (mid != 0)
        return false;

    const quint32 low = qFromBigEndian<quint32>(ptr + 12);
    if ((low == 0) && (mode & QHostAddress::ConvertUnspecifiedAddress)) {
        a = 0;
        return true;
    }
    if ((low == 1) && (mode & QHostAddress::ConvertLocalHost)) {
        a = INADDR_LOOPBACK;
        return true;
    }
    if ((low != 1) && (mode & QHostAddress::ConvertV4CompatToIPv4)) {
        a = low;
        return true;
    }
    return false;
}